

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_map.cpp
# Opt level: O3

ETraceStatus ProcessRailHit(FTraceResults *res,void *userdata)

{
  double *pdVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  uint uVar5;
  long lVar6;
  int iVar7;
  ulong uVar8;
  AActor *pAVar9;
  DVector2 ofs;
  double local_98;
  double local_88;
  double dStack_80;
  int local_70;
  int local_6c;
  double local_68;
  double dStack_60;
  double local_58;
  double dStack_50;
  double local_48;
  double dStack_40;
  int local_38;
  undefined4 uStack_34;
  double dStack_30;
  
  if (res->HitType != TRACE_HitActor) {
    if (res->HitType == TRACE_CrossingPortal) {
      dVar2 = (res->HitPos).Z;
      dVar3 = (res->SrcFromTarget).Z;
      dVar4 = (res->HitVector).Z;
      local_68 = (res->HitPos).X;
      dStack_60 = (res->HitPos).Y;
      local_58 = (res->SrcFromTarget).X;
      dStack_50 = (res->SrcFromTarget).Y;
      local_48 = (res->HitVector).X;
      dStack_40 = (res->HitVector).Y;
      TArray<SPortalHit,_SPortalHit>::Grow
                ((TArray<SPortalHit,_SPortalHit> *)((long)userdata + 0x18),1);
      lVar6 = *(long *)((long)userdata + 0x18);
      uVar5 = *(uint *)((long)userdata + 0x24);
      uVar8 = (ulong)uVar5;
      pdVar1 = (double *)(lVar6 + uVar8 * 0x48);
      *pdVar1 = local_68;
      pdVar1[1] = dStack_60;
      *(double *)(lVar6 + 0x10 + uVar8 * 0x48) = dVar2;
      pdVar1 = (double *)(lVar6 + 0x18 + uVar8 * 0x48);
      *pdVar1 = local_58;
      pdVar1[1] = dStack_50;
      *(double *)(lVar6 + 0x28 + uVar8 * 0x48) = dVar3;
      pdVar1 = (double *)(lVar6 + 0x30 + uVar8 * 0x48);
      *pdVar1 = local_48;
      pdVar1[1] = dStack_40;
      *(double *)(lVar6 + 0x40 + uVar8 * 0x48) = dVar4;
      *(uint *)((long)userdata + 0x24) = uVar5 + 1;
      return TRACE_Continue;
    }
    return TRACE_Stop;
  }
  if ((*(char *)((long)userdata + 0x2d) == '\x01') &&
     (((res->Actor->flags2).Value & 0x8000000) != 0)) {
    return TRACE_Stop;
  }
  if (*(char *)((long)userdata + 0x31) == '\0') {
    if (*(char *)((long)userdata + 0x30) == '\x01') {
      (*(res->Actor->super_DThinker).super_DObject._vptr_DObject[0x21])(&local_38);
      (**(code **)(**userdata + 0x108))(&local_6c);
      if (local_38 == local_6c) {
        return TRACE_Skip;
      }
    }
    if ((*(char *)((long)userdata + 0x2f) != '\x01') ||
       ((*(res->Actor->super_DThinker).super_DObject._vptr_DObject[0x21])(&local_70),
       local_70 != *(int *)((long)userdata + 0x28))) {
      if (*(char *)((long)userdata + 0x2e) == '\x01') {
        pAVar9 = res->Actor;
        if (((pAVar9->flags3).Value & 8) != 0) {
          return TRACE_Skip;
        }
      }
      else {
        pAVar9 = res->Actor;
      }
      local_98 = (res->HitPos).Z;
      local_88 = (res->HitPos).X;
      dStack_80 = (res->HitPos).Y;
      dVar2 = (res->SrcAngleFromTarget).Degrees;
      if ((i_compatflags._3_1_ & 0x10) != 0) {
        P_GetOffsetPosition(local_88,dStack_80,(res->HitVector).X * -10.0,(res->HitVector).Y * -10.0
                           );
        local_88 = (double)CONCAT44(uStack_34,local_38);
        dStack_80 = dStack_30;
        local_98 = local_98 + (res->HitVector).Z * 10.0;
      }
      TArray<SRailHit,_SRailHit>::Grow((TArray<SRailHit,_SRailHit> *)((long)userdata + 8),1);
      lVar6 = *(long *)((long)userdata + 8);
      uVar5 = *(uint *)((long)userdata + 0x14);
      uVar8 = (ulong)uVar5;
      *(AActor **)(lVar6 + uVar8 * 0x28) = pAVar9;
      pdVar1 = (double *)(lVar6 + 8 + uVar8 * 0x28);
      *pdVar1 = local_88;
      pdVar1[1] = dStack_80;
      *(double *)(lVar6 + 0x18 + uVar8 * 0x28) = local_98;
      *(double *)(lVar6 + 0x20 + uVar8 * 0x28) = dVar2;
      *(uint *)((long)userdata + 0x14) = uVar5 + 1;
      if (*(int *)((long)userdata + 0x34) == 0) {
        return *(byte *)((long)userdata + 0x2c) ^ TRACE_Continue;
      }
      iVar7 = *(int *)((long)userdata + 0x38) + 1;
      *(int *)((long)userdata + 0x38) = iVar7;
      if (*(char *)((long)userdata + 0x2c) == '\0') {
        return (uint)(iVar7 < *(int *)((long)userdata + 0x34));
      }
      return TRACE_Stop;
    }
  }
  return TRACE_Skip;
}

Assistant:

static ETraceStatus ProcessRailHit(FTraceResults &res, void *userdata)
{
	RailData *data = (RailData *)userdata;
	if (res.HitType == TRACE_CrossingPortal)
	{
		SPortalHit newhit;
		newhit.HitPos = res.HitPos;
		newhit.ContPos = res.SrcFromTarget;
		newhit.OutDir = res.HitVector;
		data->PortalHits.Push(newhit);
		return TRACE_Continue;
	}

	if (res.HitType != TRACE_HitActor)
	{
		return TRACE_Stop;
	}

	// Invulnerable things completely block the shot
	if (data->StopAtInvul && res.Actor->flags2 & MF2_INVULNERABLE)
	{
		return TRACE_Stop;
	}

	// Skip actors if the puff has:
	// 1. THRUACTORS (This one did NOT include a check for spectral)
	// 2. MTHRUSPECIES on puff and the shooter has same species as the hit actor
	// 3. THRUSPECIES on puff and the puff has same species as the hit actor
	// 4. THRUGHOST on puff and the GHOST flag on the hit actor

	if ((data->ThruActors) ||
		(data->MThruSpecies && res.Actor->GetSpecies() == data->Caller->GetSpecies()) ||
		(data->ThruSpecies && res.Actor->GetSpecies() == data->PuffSpecies) ||
		(data->ThruGhosts && res.Actor->flags3 & MF3_GHOST))
	{
		return TRACE_Skip;
	}

	// Save this thing for damaging later, and continue the trace
	SRailHit newhit;
	newhit.HitActor = res.Actor;
	newhit.HitPos = res.HitPos;
	newhit.HitAngle = res.SrcAngleFromTarget;
	if (i_compatflags & COMPATF_HITSCAN)
	{
		DVector2 ofs = P_GetOffsetPosition(newhit.HitPos.X, newhit.HitPos.Y, -10 * res.HitVector.X, -10 * res.HitVector.Y);
		newhit.HitPos.X = ofs.X;
		newhit.HitPos.Y = ofs.Y;
		newhit.HitPos.Z -= -10 * res.HitVector.Z;
	}
	data->RailHits.Push(newhit);

	if (data->limit)
	{
		data->count++;
	}
	return (data->StopAtOne || (data->limit && (data->count >= data->limit))) ? TRACE_Stop : TRACE_Continue;
}